

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  *(undefined ***)&this->field_0x190 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x198 = 0;
  *(char **)&this->field_0x1a0 = "IfcStructuralSurfaceMemberVarying";
  IfcStructuralSurfaceMember::IfcStructuralSurfaceMember
            (&this->super_IfcStructuralSurfaceMember,&PTR_construction_vtable_24__007913c0);
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x168 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x791268;
  *(undefined8 *)&this->field_0x190 = 0x7913a8;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x791290;
  (this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x7912b8;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x7912e0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = 0x791308;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0x791330;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0x791358;
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x160 = 0x791380;
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x170 = 0;
  *(undefined8 *)&this->field_0x178 = 0;
  *(undefined8 *)&this->field_0x180 = 0;
  (this->VaryingThicknessLocation).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}